

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

void __thiscall rlib::JsonT<void>::clear(JsonT<void> *this)

{
  int iVar1;
  int *in_RDI;
  vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_> *unaff_retaddr;
  
  iVar1 = *in_RDI;
  if (iVar1 == 4) {
    std::__cxx11::string::~string((string *)(in_RDI + 2));
  }
  else if (iVar1 == 5) {
    std::vector<rlib::JsonT<void>,_std::allocator<rlib::JsonT<void>_>_>::~vector(unaff_retaddr);
  }
  else if (iVar1 == 6) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rlib::JsonT<void>_>_>_>
            *)0x190850);
  }
  *in_RDI = 0;
  return;
}

Assistant:

void clear() {
			typedef std::string TypeString;
			switch (m_type) {
			case Type::String:	m_string.~TypeString();	break;
			case Type::Array:	m_array.~Array();		break;
			case Type::Map:		m_map.~Map();			break;
			default:		break;
			}
			m_type = Type::Null;
		}